

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O3

int cbs_str_equal(CBS *cbs,char *str)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *in_RDX;
  
  pcVar3 = (char *)strlen(in_RDX);
  uVar1 = 0;
  if (pcVar3 == str) {
    if (str == (char *)0x0) {
      uVar1 = 1;
    }
    else {
      iVar2 = bcmp(cbs,in_RDX,(size_t)str);
      uVar1 = (uint)(iVar2 == 0);
    }
  }
  return uVar1;
}

Assistant:

static int cbs_str_equal(const CBS *cbs, const char *str) {
  return CBS_len(cbs) == strlen(str) &&
         OPENSSL_memcmp(CBS_data(cbs), str, strlen(str)) == 0;
}